

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

CDefineTable * __thiscall CDefineTable::operator=(CDefineTable *this,CDefineTable *defTable)

{
  undefined8 *puVar1;
  long lVar2;
  
  RemoveAll(this);
  lVar2 = 8;
  do {
    for (puVar1 = *(undefined8 **)((long)defTable->defs + lVar2 + -8); puVar1 != (undefined8 *)0x0;
        puVar1 = (undefined8 *)puVar1[3]) {
      Add(this,(char *)*puVar1,(char *)puVar1[1],(CStringsList *)puVar1[2]);
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x408);
  return this;
}

Assistant:

CDefineTable& CDefineTable::operator=(CDefineTable const & defTable) {
	RemoveAll();
	for (CDefineTableEntry* srcDef : defTable.defs) {
		CDefineTableEntry* srcD = srcDef;
		while (srcD) {
			Add(srcD->name, srcD->value, srcD->nss);
			srcD = srcD->next;
		}
	}
	return *this;
}